

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

string * __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::print(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
        *this,int indent)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined4 extraout_var;
  reference pptVar6;
  int in_EDX;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  char cVar7;
  string *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range4;
  string_t tmp;
  pos_t i;
  string_t spaces;
  pos_t sections;
  string_t value;
  string_t *result;
  string_t *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  char cVar8;
  undefined4 in_stack_fffffffffffffe04;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffe10;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe18;
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  tag_t<cfgfile::string_trait_t> *local_130;
  tag_t<cfgfile::string_trait_t> **local_128;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_120;
  undefined8 local_118;
  string local_110 [32];
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  long local_a8;
  allocator local_99;
  string local_98 [32];
  long local_78;
  string local_70 [39];
  allocator local_49;
  string local_48 [51];
  undefined1 local_15;
  int local_14;
  string *what;
  
  local_15 = 0;
  local_14 = in_EDX;
  what = in_RDI;
  std::__cxx11::string::string(in_RDI);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffe18);
  cVar7 = const_t<cfgfile::string_trait_t>::c_tab;
  if (bVar1) {
    uVar3 = (ulong)local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,uVar3,cVar7,&local_49);
    std::__cxx11::string::append(in_RDI);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    cVar7 = (char)in_RDI;
    std::__cxx11::string::push_back(cVar7);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RSI);
    std::__cxx11::string::append(in_RDI);
    std::__cxx11::string::push_back(cVar7);
    format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ::to_string(in_stack_fffffffffffffdf8);
    uVar3 = std::__cxx11::string::length();
    uVar4 = std::__cxx11::string::length();
    local_78 = uVar3 / 0x50 + (long)(int)(uint)(uVar4 % 0x50 != 0);
    if (local_78 == 0) {
      std::__cxx11::string::push_back(cVar7);
      std::__cxx11::string::push_back(cVar7);
    }
    else {
      tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RSI);
      lVar5 = std::__cxx11::string::length();
      cVar8 = const_t<cfgfile::string_trait_t>::c_space;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,lVar5 + 2,cVar8,&local_99);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      for (local_a8 = 0; local_a8 < local_78; local_a8 = local_a8 + 1) {
        if (0 < local_a8) {
          std::__cxx11::string::push_back(cVar7);
          cVar8 = const_t<cfgfile::string_trait_t>::c_tab;
          uVar3 = (ulong)local_14;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,uVar3,cVar8,&local_c9);
          std::__cxx11::string::append(in_RDI);
          std::__cxx11::string::~string(local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          std::__cxx11::string::append(in_RDI);
        }
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_70);
        to_cfgfile_format<cfgfile::string_trait_t>((string_t *)what);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::append(in_RDI);
        std::__cxx11::string::~string(local_f0);
      }
      std::__cxx11::string::~string(local_98);
    }
    (*in_RSI->_vptr_tag_t[2])();
    bVar1 = std::
            vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ::empty(in_stack_fffffffffffffe10);
    if (!bVar1) {
      std::__cxx11::string::push_back(cVar7);
      iVar2 = (*in_RSI->_vptr_tag_t[2])();
      local_118 = CONCAT44(extraout_var,iVar2);
      local_120._M_current =
           (tag_t<cfgfile::string_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
           ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    *)in_stack_fffffffffffffdf8);
      local_128 = (tag_t<cfgfile::string_trait_t> **)
                  std::
                  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                  ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                         *)in_stack_fffffffffffffdf8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffdf8), bVar1) {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::operator*(&local_120);
        local_130 = *pptVar6;
        (*local_130->_vptr_tag_t[3])(local_150,local_130,(ulong)(local_14 + 1));
        std::__cxx11::string::append(in_RDI);
        std::__cxx11::string::~string(local_150);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::operator++(&local_120);
      }
      uVar3 = (ulong)local_14;
      cVar8 = const_t<cfgfile::string_trait_t>::c_tab;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,uVar3,cVar8,&local_171);
      std::__cxx11::string::append(in_RDI);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
    }
    std::__cxx11::string::push_back(cVar7);
    std::__cxx11::string::push_back(cVar7);
    std::__cxx11::string::~string(local_70);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			typename Trait::string_t value =
				format_t< typename Trait::string_t, Trait >::to_string( m_value );

			const typename Trait::pos_t sections =
				( value.length() / c_max_string_length +
				( value.length() % c_max_string_length > 0 ? 1 : 0 ) );

			if( sections )
			{
				const typename Trait::string_t spaces =
					typename Trait::string_t( this->name().length() + 2,
						const_t< Trait >::c_space );

				for( typename Trait::pos_t i = 0; i < sections; ++i )
				{
					if( i > 0 )
					{
						result.push_back( const_t< Trait >::c_carriage_return );

						result.append( typename Trait::string_t( indent,
							const_t< Trait >::c_tab ) );

						result.append( spaces );
					}

					const typename Trait::string_t tmp =
						to_cfgfile_format< Trait > (
							value.substr( i * c_max_string_length,
								c_max_string_length ) );

					result.append( tmp );
				}
			}
			else
			{
				result.push_back( const_t< Trait >::c_quotes );
				result.push_back( const_t< Trait >::c_quotes );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}